

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool Curl_ssl_config_matches(ssl_primary_config *data,ssl_primary_config *needle)

{
  int iVar1;
  
  if (((((data->version == needle->version) && (data->version_max == needle->version_max)) &&
       (data->verifypeer == needle->verifypeer)) &&
      ((data->verifyhost == needle->verifyhost &&
       (iVar1 = Curl_safe_strcasecompare(data->CApath,needle->CApath), iVar1 != 0)))) &&
     ((iVar1 = Curl_safe_strcasecompare(data->CAfile,needle->CAfile), iVar1 != 0 &&
      ((iVar1 = Curl_safe_strcasecompare(data->clientcert,needle->clientcert), iVar1 != 0 &&
       (iVar1 = Curl_safe_strcasecompare(data->cipher_list,needle->cipher_list), iVar1 != 0)))))) {
    return true;
  }
  return false;
}

Assistant:

bool
Curl_ssl_config_matches(struct ssl_primary_config* data,
                        struct ssl_primary_config* needle)
{
  if((data->version == needle->version) &&
     (data->version_max == needle->version_max) &&
     (data->verifypeer == needle->verifypeer) &&
     (data->verifyhost == needle->verifyhost) &&
     Curl_safe_strcasecompare(data->CApath, needle->CApath) &&
     Curl_safe_strcasecompare(data->CAfile, needle->CAfile) &&
     Curl_safe_strcasecompare(data->clientcert, needle->clientcert) &&
     Curl_safe_strcasecompare(data->cipher_list, needle->cipher_list))
    return TRUE;

  return FALSE;
}